

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t *
Acb_DerivePatchSupportS
          (Cnf_Dat_t *pCnf,int nCiTars,int nCoDivs,Vec_Int_t *vDivs,Acb_Ntk_t *pNtkF,
          Vec_Int_t *vSuppOld,int TimeOut)

{
  Cnf_Dat_t *pCVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  satoko_opts_t *psVar6;
  int *piVar7;
  abctime aVar8;
  int *piStack_88;
  int nFinal;
  int *pFinal;
  abctime clk_1;
  int local_70;
  int iDivVar;
  int nSuppNew;
  int status;
  int iLit;
  int fUseMinAssump;
  abctime clk;
  satoko_t *pSat;
  int iCiVarBeg;
  int iCoVarBeg;
  int Lit;
  int i;
  Vec_Int_t *vSupp;
  Vec_Int_t *vSuppOld_local;
  Acb_Ntk_t *pNtkF_local;
  Vec_Int_t *vDivs_local;
  int nCoDivs_local;
  int nCiTars_local;
  Cnf_Dat_t *pCnf_local;
  
  vSupp = vSuppOld;
  vSuppOld_local = (Vec_Int_t *)pNtkF;
  pNtkF_local = (Acb_Ntk_t *)vDivs;
  vDivs_local._0_4_ = nCoDivs;
  vDivs_local._4_4_ = nCiTars;
  _nCoDivs_local = pCnf;
  _Lit = (Cnf_Dat_t *)Vec_IntAlloc(100);
  pSat._4_4_ = 1;
  pSat._0_4_ = _nCoDivs_local->nVars - vDivs_local._4_4_;
  clk = (abctime)satoko_create();
  satoko_setnvars((solver_t *)clk,_nCoDivs_local->nVars * 2 + vDivs_local._4_4_ + (int)vDivs_local);
  psVar6 = satoko_options((satoko_t *)clk);
  psVar6->no_simplify = '\x01';
  for (iCoVarBeg = 0; iCoVarBeg < _nCoDivs_local->nClauses; iCoVarBeg = iCoVarBeg + 1) {
    iVar2 = satoko_add_clause((solver_t *)clk,_nCoDivs_local->pClauses[iCoVarBeg],
                              (int)((long)_nCoDivs_local->pClauses[iCoVarBeg + 1] -
                                    (long)_nCoDivs_local->pClauses[iCoVarBeg] >> 2));
    if (iVar2 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  iCiVarBeg = Abc_Var2Lit(pSat._4_4_,0);
  iVar2 = satoko_add_clause((solver_t *)clk,&iCiVarBeg,1);
  if (iVar2 == 0) {
    pCnf_local = (Cnf_Dat_t *)0x0;
  }
  else {
    _nCoDivs_local->pMan = (Aig_Man_t *)0x0;
    Cnf_DataLift(_nCoDivs_local,_nCoDivs_local->nVars);
    for (iCoVarBeg = 0; iCoVarBeg < _nCoDivs_local->nClauses; iCoVarBeg = iCoVarBeg + 1) {
      iVar2 = satoko_add_clause((solver_t *)clk,_nCoDivs_local->pClauses[iCoVarBeg],
                                (int)((long)_nCoDivs_local->pClauses[iCoVarBeg + 1] -
                                      (long)_nCoDivs_local->pClauses[iCoVarBeg] >> 2));
      if (iVar2 == 0) {
        return (Vec_Int_t *)0x0;
      }
    }
    Cnf_DataLift(_nCoDivs_local,-_nCoDivs_local->nVars);
    iCiVarBeg = Abc_Var2Lit(pSat._4_4_ + _nCoDivs_local->nVars,0);
    iVar2 = satoko_add_clause((solver_t *)clk,&iCiVarBeg,1);
    if (iVar2 == 0) {
      pCnf_local = (Cnf_Dat_t *)0x0;
    }
    else {
      if (0 < vDivs_local._4_4_) {
        iCiVarBeg = Abc_Var2Lit((int)pSat,1);
        iVar2 = satoko_add_clause((solver_t *)clk,&iCiVarBeg,1);
        if (iVar2 == 0) {
          return (Vec_Int_t *)0x0;
        }
        iCiVarBeg = Abc_Var2Lit((int)pSat + _nCoDivs_local->nVars,0);
        iVar2 = satoko_add_clause((solver_t *)clk,&iCiVarBeg,1);
        if (iVar2 == 0) {
          return (Vec_Int_t *)0x0;
        }
      }
      if (0 < (int)vDivs_local) {
        _iLit = Abc_Clock();
        status = 1;
        clk_1._4_4_ = _nCoDivs_local->nVars * 2 + vDivs_local._4_4_;
        Vec_IntClear((Vec_Int_t *)_Lit);
        for (iCoVarBeg = 0; aVar8 = clk, iCoVarBeg < (int)vDivs_local; iCoVarBeg = iCoVarBeg + 1) {
          satoko_add_xor((satoko_t *)clk,clk_1._4_4_ + iCoVarBeg,pSat._4_4_ + 1 + iCoVarBeg,
                         pSat._4_4_ + 1 + iCoVarBeg + _nCoDivs_local->nVars,0);
          pCVar1 = _Lit;
          iVar2 = Abc_Var2Lit(clk_1._4_4_ + iCoVarBeg,1);
          Vec_IntPush((Vec_Int_t *)pCVar1,iVar2);
        }
        piVar7 = Vec_IntArray((Vec_Int_t *)_Lit);
        iVar2 = Vec_IntSize((Vec_Int_t *)_Lit);
        iDivVar = satoko_solve_assumptions((solver_t *)aVar8,piVar7,iVar2);
        if (iDivVar != -1) {
          printf("Demonstrated that the problem has NO solution.  ");
          aVar8 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar8 - _iLit);
          satoko_destroy((solver_t *)clk);
          Vec_IntFree((Vec_Int_t *)_Lit);
          return (Vec_Int_t *)0x0;
        }
        printf("Proved that the problem has a solution.  ");
        aVar8 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar8 - _iLit);
        if (status == 0) {
          uVar3 = satoko_final_conflict((solver_t *)clk,&stack0xffffffffffffff78);
          uVar4 = Vec_IntSize((Vec_Int_t *)_Lit);
          printf("AnalyzeFinal returned %d (out of %d).\n",(ulong)uVar3,(ulong)uVar4);
          Vec_IntClear((Vec_Int_t *)_Lit);
          for (iCoVarBeg = 0; pCVar1 = _Lit, aVar8 = clk, iCoVarBeg < (int)uVar3;
              iCoVarBeg = iCoVarBeg + 1) {
            iVar2 = Abc_LitNot(piStack_88[iCoVarBeg]);
            Vec_IntPush((Vec_Int_t *)pCVar1,iVar2);
          }
          piVar7 = Vec_IntArray((Vec_Int_t *)_Lit);
          iVar2 = Vec_IntSize((Vec_Int_t *)_Lit);
          iDivVar = satoko_solve_assumptions((solver_t *)aVar8,piVar7,iVar2);
          if (iDivVar != -1) {
            __assert_fail("status == l_False",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x5c4,
                          "Vec_Int_t *Acb_DerivePatchSupportS(Cnf_Dat_t *, int, int, Vec_Int_t *, Acb_Ntk_t *, Vec_Int_t *, int)"
                         );
          }
          uVar3 = satoko_final_conflict((solver_t *)clk,&stack0xffffffffffffff78);
          uVar4 = Vec_IntSize((Vec_Int_t *)_Lit);
          printf("AnalyzeFinal returned %d (out of %d).\n",(ulong)uVar3,(ulong)uVar4);
        }
        else {
          pFinal = (int *)Abc_Clock();
          aVar8 = clk;
          piVar7 = Vec_IntArray((Vec_Int_t *)_Lit);
          iVar2 = Vec_IntSize((Vec_Int_t *)_Lit);
          local_70 = satoko_minimize_assumptions((satoko_t *)aVar8,piVar7,iVar2,0);
          Vec_IntShrink((Vec_Int_t *)_Lit,local_70);
          uVar3 = Vec_IntSize((Vec_Int_t *)_Lit);
          printf("Solved the problem with %d supp vars.  ",(ulong)uVar3);
          aVar8 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar8 - (long)pFinal);
        }
        for (iCoVarBeg = 0; iVar2 = iCoVarBeg, iVar5 = Vec_IntSize((Vec_Int_t *)_Lit), iVar2 < iVar5
            ; iCoVarBeg = iCoVarBeg + 1) {
          nSuppNew = Vec_IntEntry((Vec_Int_t *)_Lit,iCoVarBeg);
          pCVar1 = _Lit;
          iVar2 = iCoVarBeg;
          iVar5 = Abc_Lit2Var(nSuppNew);
          Vec_IntWriteEntry((Vec_Int_t *)pCVar1,iVar2,iVar5 - clk_1._4_4_);
        }
        Vec_IntSort((Vec_Int_t *)_Lit,0);
      }
      satoko_destroy((solver_t *)clk);
      Vec_IntSort((Vec_Int_t *)_Lit,0);
      pCnf_local = _Lit;
    }
  }
  return (Vec_Int_t *)pCnf_local;
}

Assistant:

Vec_Int_t * Acb_DerivePatchSupportS( Cnf_Dat_t * pCnf, int nCiTars, int nCoDivs, Vec_Int_t * vDivs, Acb_Ntk_t * pNtkF, Vec_Int_t * vSuppOld, int TimeOut )
{
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    int i, Lit;
    int iCoVarBeg = 1;
    int iCiVarBeg = pCnf->nVars - nCiTars;
    satoko_t * pSat = satoko_create();
    satoko_setnvars( pSat, 2 * pCnf->nVars + nCiTars + nCoDivs );
    satoko_options(pSat)->no_simplify = 1;
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !satoko_add_clause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            return NULL;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !satoko_add_clause( pSat, &Lit, 1 ) )
        return NULL;
    // add clauses
    pCnf->pMan = NULL;
    Cnf_DataLift( pCnf, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !satoko_add_clause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            return NULL;
    Cnf_DataLift( pCnf, -pCnf->nVars );
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg+pCnf->nVars, 0 );
    if ( !satoko_add_clause( pSat, &Lit, 1 ) )
        return NULL;
    // create XORs for targets
    if ( nCiTars > 0 )
    {
/*
        int iXorVar = 2 * pCnf->nVars;
        int Lit;
        Vec_IntClear( vSupp );
        for ( i = 0; i < nCiTars; i++ )
        {
            satoko_add_xor( pSat, iXorVar+i, iCiVarBeg+i, iCiVarBeg+i+pCnf->nVars, 0 );
            Vec_IntPush( vSupp, Abc_Var2Lit(iXorVar+i, 0) );
        }
        if ( !satoko_add_clause( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp) ) )
            return NULL;
*/
        // add negative literal
        Lit = Abc_Var2Lit( iCiVarBeg, 1 );
        if ( !satoko_add_clause( pSat, &Lit, 1 ) )
            return NULL;
        // add positive literal
        Lit = Abc_Var2Lit( iCiVarBeg+pCnf->nVars, 0 );
        if ( !satoko_add_clause( pSat, &Lit, 1 ) )
            return NULL;
    }
    // create XORs for divisors
    if ( nCoDivs > 0 )
    {
        abctime clk = Abc_Clock();
        int fUseMinAssump = 1;
        int iLit, status, nSuppNew;
        int iDivVar = 2 * pCnf->nVars + nCiTars;
        Vec_IntClear( vSupp );
        for ( i = 0; i < nCoDivs; i++ )
        {
            satoko_add_xor( pSat, iDivVar+i, iCoVarBeg+1+i, iCoVarBeg+1+i+pCnf->nVars, 0 );
            Vec_IntPush( vSupp, Abc_Var2Lit(iDivVar+i, 1) );
/*                
            pLits[0] = Abc_Var2Lit(iCoVarBeg+1+i,             1);
            pLits[1] = Abc_Var2Lit(iCoVarBeg+1+i+pCnf->nVars, 0);
            pLits[2] = Abc_Var2Lit(iDivVar+i,                 1);
            if ( !satoko_add_clause( pSat, pLits, 3 ) )
                assert( 0 );

            pLits[0] = Abc_Var2Lit(iCoVarBeg+1+i,             0);
            pLits[1] = Abc_Var2Lit(iCoVarBeg+1+i+pCnf->nVars, 1);
            pLits[2] = Abc_Var2Lit(iDivVar+i,                 1);
            if ( !satoko_add_clause( pSat, pLits, 3 ) )
                assert( 0 );

            Vec_IntPush( vSupp, Abc_Var2Lit(iDivVar+i, 0) );
*/
        }

        // try one run
        status = satoko_solve_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp) );
        if ( status != l_False )
        {
            printf( "Demonstrated that the problem has NO solution.  " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            satoko_destroy( pSat );
            Vec_IntFree( vSupp );
            return NULL;
        }
        assert( status == l_False );
        printf( "Proved that the problem has a solution.  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

        // find minimum subset
        if ( fUseMinAssump )
        {
            abctime clk = Abc_Clock();
            nSuppNew = satoko_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
            Vec_IntShrink( vSupp, nSuppNew );
            printf( "Solved the problem with %d supp vars.  ", Vec_IntSize(vSupp) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        else
        {
            int * pFinal, nFinal = satoko_final_conflict( pSat, &pFinal );
            printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
            Vec_IntClear( vSupp ); 
            for ( i = 0; i < nFinal; i++ )
                Vec_IntPush( vSupp, Abc_LitNot(pFinal[i]) );
            // try one run
            status = satoko_solve_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp) );
            assert( status == l_False );
            // try again
            nFinal = satoko_final_conflict( pSat, &pFinal );
            printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
        }

        // remap them into numbers
        Vec_IntForEachEntry( vSupp, iLit, i )
            Vec_IntWriteEntry( vSupp, i, Abc_Lit2Var(iLit)-iDivVar );
        Vec_IntSort( vSupp, 0 );
        //Vec_IntPrint( vSupp );
    }
    satoko_destroy( pSat );
    Vec_IntSort( vSupp, 0 );
    return vSupp;
}